

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

void read_file_contents_proc(Am_Object param_1,Am_Value_List *contents)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_Object item;
  Am_Value_List current;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30 [16];
  
  pAVar1 = (Am_Value *)Am_Object::Get(0x1480,0x82);
  Am_Value_List::Am_Value_List(local_30,pAVar1);
  local_40.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_40,pAVar1);
    Am_Object::Remove_From_Owner();
    Am_Value_List::Next();
  }
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_40,pAVar1);
    Am_Object::Am_Object(&local_38,&local_40);
    Am_Object::Add_Part((Am_Object)0x111480,SUB81(&local_38,0),1);
    Am_Object::~Am_Object(&local_38);
    Am_Value_List::Next();
  }
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(local_30);
  return;
}

Assistant:

Am_Define_Method (Am_Handle_Loaded_Items_Method, void, read_file_contents,
		  (Am_Object /* command */, Am_Value_List &contents)) {
  Am_Value_List current = created_objs.Get (Am_GRAPHICAL_PARTS);
  Am_Object item;
  for (current.Start (); !current.Last (); current.Next ()) {
    item = current.Get ();
    item.Remove_From_Owner ();
  }
  for (contents.Start (); !contents.Last (); contents.Next ()) {
    item = contents.Get ();
    created_objs.Add_Part (item);
  }
}